

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O1

void __thiscall FactoredMMDPDiscrete::Initialize2DBNObservations(FactoredMMDPDiscrete *this)

{
  pointer ppCVar1;
  ulong uVar2;
  CPDDiscreteInterface *pCVar3;
  E *this_00;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                 super_MultiAgentDecisionProcess + 0x10))();
  if (uVar2 == 0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"FactoredMMDPDiscrete::Initialize2DBNObservations() no agents specified");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  uVar4 = 1;
  uVar5 = 0;
  do {
    pCVar3 = (CPDDiscreteInterface *)operator_new(8);
    pCVar3->_vptr_CPDDiscreteInterface = (_func_int **)&PTR__CPDDiscreteInterface_005e6558;
    ppCVar1 = (this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn._m_O_CPDs.
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&(this->super_FactoredDecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn.
                               _m_O_CPDs.
                               super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                               ._M_impl.super__Vector_impl_data + 8) - (long)ppCVar1 >> 3) <= uVar5)
    {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
    }
    ppCVar1[uVar5] = pCVar3;
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar5 < uVar2);
  return;
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBNObservations() {
    size_t nrAgents = GetNrAgents();
    if(nrAgents == 0)
        throw(E("FactoredMMDPDiscrete::Initialize2DBNObservations() no agents specified"));
    
    for(Index i=0; i<nrAgents; i++) {
        // attach identity function to 2BDN (fully-observable scenario)
        Get2DBN()->SetCPD_O(i, new CPDKroneckerDelta());
    }
}